

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

CURLcode file_do(Curl_easy *data,_Bool *done)

{
  FILEPROTO *pFVar1;
  bool bVar2;
  byte bVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  CURLcode CVar7;
  CURLcode CVar8;
  char *pcVar9;
  size_t sVar10;
  __off64_t _Var11;
  DIR *__dirp;
  dirent64 *pdVar12;
  size_t sVar13;
  char *pcVar14;
  size_t sVar15;
  long lVar16;
  curl_off_t __offset;
  size_t sVar17;
  long lVar18;
  bool bVar19;
  curltime cVar20;
  _Bool eos;
  int local_15c;
  size_t local_158;
  size_t xfer_blen;
  uint local_148;
  uint local_144;
  int local_140;
  int local_13c;
  int local_138;
  char *xfer_buf;
  stat statbuf;
  
  *done = true;
  pFVar1 = (data->req).p.file;
  if (((data->state).field_0x7c0 & 8) == 0) {
    local_15c = pFVar1->fd;
    iVar5 = fstat64(local_15c,(stat64 *)&statbuf);
    if (iVar5 == -1) {
      lVar16 = -1;
LAB_00126511:
      CVar7 = Curl_range(data);
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      __offset = (data->state).resume_from;
      if (__offset < 0) {
        if (iVar5 == -1) {
          Curl_failf(data,"cannot get the size of file.");
          return CURLE_READ_ERROR;
        }
        __offset = __offset + statbuf.st_size;
        (data->state).resume_from = __offset;
      }
      lVar18 = lVar16;
      if ((0 < __offset) && (lVar18 = lVar16 - __offset, lVar16 < __offset)) {
        Curl_failf(data,"failed to resume file:// transfer");
        return CURLE_BAD_DOWNLOAD_RESUME;
      }
      bVar19 = iVar5 != -1;
      lVar16 = (data->req).maxdownload;
      if (0 < lVar16) {
        lVar18 = lVar16;
      }
      bVar2 = 0 < lVar18;
      if (bVar2 && bVar19) {
        Curl_pgrsSetDownloadSize(data,lVar18);
        __offset = (data->state).resume_from;
      }
      if (__offset != 0) {
        if ((statbuf.st_mode & 0xf000) == 0x4000) {
          return CURLE_BAD_DOWNLOAD_RESUME;
        }
        _Var11 = lseek64(local_15c,__offset,0);
        if (__offset != _Var11) {
          return CURLE_BAD_DOWNLOAD_RESUME;
        }
      }
      CVar7 = Curl_multi_xfer_buf_borrow(data,&xfer_buf,&xfer_blen);
      if (CVar7 == CURLE_OK) {
        if ((statbuf.st_mode & 0xf000) == 0x4000) {
          __dirp = opendir(pFVar1->path);
          if (__dirp == (DIR *)0x0) {
            CVar7 = CURLE_READ_ERROR;
          }
          else {
            while (pdVar12 = readdir64(__dirp), pdVar12 != (dirent64 *)0x0) {
              if (pdVar12->d_name[0] != '.') {
                sVar13 = strlen(pdVar12->d_name);
                CVar8 = Curl_client_write(data,1,pdVar12->d_name,sVar13);
                if ((CVar8 != CURLE_OK) ||
                   (CVar8 = Curl_client_write(data,1,"\n",1), CVar8 != CURLE_OK)) goto LAB_0012699e;
              }
            }
            CVar8 = CURLE_OK;
LAB_0012699e:
            closedir(__dirp);
LAB_001269a6:
            iVar5 = Curl_pgrsUpdate(data);
            CVar7 = CURLE_ABORTED_BY_CALLBACK;
            if (iVar5 == 0) {
              CVar7 = CVar8;
            }
          }
        }
        else {
          do {
            sVar15 = CONCAT44(xfer_blen._4_4_,(uint)xfer_blen) - 1;
            if (lVar18 < (long)sVar15 && (bVar2 && bVar19)) {
              sVar15 = curlx_sotouz(lVar18);
            }
            sVar15 = read(local_15c,xfer_buf,sVar15);
            if (0 < (long)sVar15) {
              xfer_buf[sVar15] = '\0';
            }
            CVar8 = CURLE_OK;
            if (((long)sVar15 < 1) || (lVar18 == 0 && (bVar2 && bVar19))) goto LAB_001269a6;
            sVar17 = sVar15;
            if (!bVar2 || !bVar19) {
              sVar17 = 0;
            }
            CVar7 = Curl_client_write(data,1,xfer_buf,sVar15);
            if ((CVar7 != CURLE_OK) ||
               (iVar5 = Curl_pgrsUpdate(data), CVar7 = CURLE_ABORTED_BY_CALLBACK, iVar5 != 0))
            break;
            lVar18 = lVar18 - sVar17;
            cVar20 = Curl_now();
            CVar7 = Curl_speedcheck(data,cVar20);
          } while (CVar7 == CURLE_OK);
        }
      }
      Curl_multi_xfer_buf_release(data,xfer_buf);
      return CVar7;
    }
    lVar16 = statbuf.st_size;
    if ((statbuf.st_mode & 0xf000) == 0x4000) {
      lVar16 = -1;
    }
    (data->info).filetime = statbuf.st_mtim.tv_sec;
    if ((((data->state).range != (char *)0x0) || ((data->set).timecondition == '\0')) ||
       (_Var4 = Curl_meets_timecondition(data,statbuf.st_mtim.tv_sec), _Var4)) {
      if (-1 < lVar16) {
        iVar6 = curl_msnprintf((char *)&xfer_buf,0x50,"Content-Length: %ld\r\n",lVar16);
        CVar7 = Curl_client_write(data,4,(char *)&xfer_buf,(long)iVar6);
        if (CVar7 != CURLE_OK) {
          return CVar7;
        }
        CVar7 = Curl_client_write(data,4,"Accept-ranges: bytes\r\n",0x16);
        if (CVar7 != CURLE_OK) {
          return CVar7;
        }
      }
      CVar7 = Curl_gmtime(statbuf.st_mtim.tv_sec,(tm *)&xfer_blen);
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      iVar6 = 6;
      if (local_138 != 0) {
        iVar6 = local_138 + -1;
      }
      iVar6 = curl_msnprintf((char *)&xfer_buf,0x50,
                             "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                             Curl_wkday[iVar6],(ulong)local_144,Curl_month[local_140],
                             (ulong)(local_13c + 0x76c),(ulong)local_148,(ulong)xfer_blen._4_4_,
                             (ulong)(uint)xfer_blen);
      CVar7 = Curl_client_write(data,4,(char *)&xfer_buf,(long)iVar6);
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      CVar7 = Curl_client_write(data,4,"\r\n",2);
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      Curl_pgrsSetDownloadSize(data,lVar16);
      if ((*(uint *)&(data->req).field_0xd1 >> 0x11 & 1) == 0) goto LAB_00126511;
    }
    return CURLE_OK;
  }
  pcVar14 = pFVar1->path;
  pcVar9 = strchr(pcVar14,0x2f);
  eos = false;
  if (pcVar9 == (char *)0x0) {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  if (pcVar9[1] == '\0') {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  iVar5 = open64(pcVar14,(uint)((data->state).resume_from != 0) * 0x200 + 0x241,
                 (ulong)(data->set).new_file_perms);
  if (iVar5 < 0) {
    pcVar14 = pFVar1->path;
    pcVar9 = "cannot open %s for writing";
LAB_00126708:
    Curl_failf(data,pcVar9,pcVar14);
    CVar7 = CURLE_WRITE_ERROR;
  }
  else {
    lVar16 = (data->state).infilesize;
    if (lVar16 != -1) {
      Curl_pgrsSetUploadSize(data,lVar16);
    }
    if ((data->state).resume_from < 0) {
      iVar6 = fstat64(iVar5,(stat64 *)&statbuf);
      if (iVar6 != 0) {
        close(iVar5);
        pcVar14 = pFVar1->path;
        pcVar9 = "cannot get the size of %s";
        goto LAB_00126708;
      }
      (data->state).resume_from = statbuf.st_size;
    }
    CVar7 = Curl_multi_xfer_ulbuf_borrow(data,&xfer_buf,&xfer_blen);
    if (CVar7 == CURLE_OK) {
      lVar16 = 0;
      CVar7 = CURLE_OK;
      bVar3 = 0;
      while( true ) {
        if (((CVar7 != CURLE_OK) || ((bVar3 & 1) != 0)) ||
           (CVar7 = Curl_client_read(data,xfer_buf,CONCAT44(xfer_blen._4_4_,(uint)xfer_blen),
                                     &local_158,&eos), CVar7 != CURLE_OK)) goto LAB_00126884;
        if (local_158 == 0) break;
        lVar18 = (data->state).resume_from;
        pcVar14 = xfer_buf;
        sVar13 = local_158;
        if (lVar18 != 0) {
          if (local_158 - lVar18 == 0 || (long)local_158 < lVar18) {
            (data->state).resume_from = lVar18 - local_158;
            sVar13 = 0;
          }
          else {
            (data->state).resume_from = 0;
            pcVar14 = xfer_buf + lVar18;
            sVar13 = local_158 - lVar18;
          }
        }
        sVar10 = write(iVar5,pcVar14,sVar13);
        if (sVar10 != sVar13) {
          CVar7 = CURLE_SEND_ERROR;
          goto LAB_00126884;
        }
        lVar16 = lVar16 + sVar13;
        Curl_pgrsSetUploadCounter(data,lVar16);
        iVar6 = Curl_pgrsUpdate(data);
        CVar7 = CURLE_ABORTED_BY_CALLBACK;
        bVar3 = eos;
        if (iVar6 == 0) {
          cVar20 = Curl_now();
          CVar7 = Curl_speedcheck(data,cVar20);
          bVar3 = eos;
        }
      }
      CVar7 = CURLE_OK;
LAB_00126884:
      if (CVar7 == CURLE_OK) {
        iVar6 = Curl_pgrsUpdate(data);
        CVar7 = CURLE_ABORTED_BY_CALLBACK;
        if (iVar6 == 0) {
          CVar7 = CURLE_OK;
        }
      }
    }
    close(iVar5);
    Curl_multi_xfer_ulbuf_release(data,xfer_buf);
  }
  return CVar7;
}

Assistant:

static CURLcode file_do(struct Curl_easy *data, bool *done)
{
  /* This implementation ignores the hostname in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size = -1;
  bool size_known;
  bool fstated = FALSE;
  int fd;
  struct FILEPROTO *file;
  char *xfer_buf;
  size_t xfer_blen;

  *done = TRUE; /* unconditionally */

  if(data->state.upload)
    return file_upload(data);

  file = data->req.p.file;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    if(!S_ISDIR(statbuf.st_mode))
      expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition &&
     !Curl_meets_timecondition(data, data->info.filetime))
    return CURLE_OK;

  if(fstated) {
    time_t filetime;
    struct tm buffer;
    const struct tm *tm = &buffer;
    char header[80];
    int headerlen;
    static const char accept_ranges[]= { "Accept-ranges: bytes\r\n" };
    if(expected_size >= 0) {
      headerlen =
        msnprintf(header, sizeof(header), "Content-Length: %" FMT_OFF_T "\r\n",
                  expected_size);
      result = Curl_client_write(data, CLIENTWRITE_HEADER, header, headerlen);
      if(result)
        return result;

      result = Curl_client_write(data, CLIENTWRITE_HEADER,
                                 accept_ranges, sizeof(accept_ranges) - 1);
      if(result != CURLE_OK)
        return result;
    }

    filetime = (time_t)statbuf.st_mtime;
    result = Curl_gmtime(filetime, &buffer);
    if(result)
      return result;

    /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
    headerlen =
      msnprintf(header, sizeof(header),
                "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                Curl_wkday[tm->tm_wday ? tm->tm_wday-1 : 6],
                tm->tm_mday,
                Curl_month[tm->tm_mon],
                tm->tm_year + 1900,
                tm->tm_hour,
                tm->tm_min,
                tm->tm_sec);
    result = Curl_client_write(data, CLIENTWRITE_HEADER, header, headerlen);
    if(!result)
      /* end of headers */
      result = Curl_client_write(data, CLIENTWRITE_HEADER, "\r\n", 2);
    if(result)
      return result;
    /* set the file size to make it available post transfer */
    Curl_pgrsSetDownloadSize(data, expected_size);
    if(data->req.no_body)
      return CURLE_OK;
  }

  /* Check whether file range has been specified */
  result = Curl_range(data);
  if(result)
    return result;

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream if the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "cannot get the size of file.");
      return CURLE_READ_ERROR;
    }
    data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from > 0) {
    /* We check explicitly if we have a start offset, because
     * expected_size may be -1 if we do not know how large the file is,
     * in which case we should not adjust it. */
    if(data->state.resume_from <= expected_size)
      expected_size -= data->state.resume_from;
    else {
      failf(data, "failed to resume file:// transfer");
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(!fstated || (expected_size <= 0))
    size_known = FALSE;
  else
    size_known = TRUE;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(size_known)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(!S_ISDIR(statbuf.st_mode)) {
#if defined(__AMIGA__) || defined(__MINGW32CE__)
      if(data->state.resume_from !=
          lseek(fd, (off_t)data->state.resume_from, SEEK_SET))
#else
      if(data->state.resume_from !=
          lseek(fd, data->state.resume_from, SEEK_SET))
#endif
        return CURLE_BAD_DOWNLOAD_RESUME;
    }
    else {
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
  }

  result = Curl_multi_xfer_buf_borrow(data, &xfer_buf, &xfer_blen);
  if(result)
    goto out;

  if(!S_ISDIR(statbuf.st_mode)) {
    while(!result) {
      ssize_t nread;
      /* Do not fill a whole buffer if we want less than all data */
      size_t bytestoread;

      if(size_known) {
        bytestoread = (expected_size < (curl_off_t)(xfer_blen-1)) ?
          curlx_sotouz(expected_size) : (xfer_blen-1);
      }
      else
        bytestoread = xfer_blen-1;

      nread = read(fd, xfer_buf, bytestoread);

      if(nread > 0)
        xfer_buf[nread] = 0;

      if(nread <= 0 || (size_known && (expected_size == 0)))
        break;

      if(size_known)
        expected_size -= nread;

      result = Curl_client_write(data, CLIENTWRITE_BODY, xfer_buf, nread);
      if(result)
        goto out;

      if(Curl_pgrsUpdate(data))
        result = CURLE_ABORTED_BY_CALLBACK;
      else
        result = Curl_speedcheck(data, Curl_now());
      if(result)
        goto out;
    }
  }
  else {
#ifdef HAVE_OPENDIR
    DIR *dir = opendir(file->path);
    struct dirent *entry;

    if(!dir) {
      result = CURLE_READ_ERROR;
      goto out;
    }
    else {
      while((entry = readdir(dir))) {
        if(entry->d_name[0] != '.') {
          result = Curl_client_write(data, CLIENTWRITE_BODY,
                   entry->d_name, strlen(entry->d_name));
          if(result)
            break;
          result = Curl_client_write(data, CLIENTWRITE_BODY, "\n", 1);
          if(result)
            break;
        }
      }
      closedir(dir);
    }
#else
    failf(data, "Directory listing not yet implemented on this platform.");
    result = CURLE_READ_ERROR;
#endif
  }

  if(Curl_pgrsUpdate(data))
    result = CURLE_ABORTED_BY_CALLBACK;

out:
  Curl_multi_xfer_buf_release(data, xfer_buf);
  return result;
}